

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

bool __thiscall
tinyusdz::MaterialBinding::get_materialBinding
          (MaterialBinding *this,token *mat_purpose,Relationship *relOut)

{
  bool bVar1;
  Relationship *pRVar2;
  size_type sVar3;
  
  if (relOut == (Relationship *)0x0) {
    return false;
  }
  if ((mat_purpose->str_)._M_string_length == 0) {
    if ((this->materialBinding).has_value_ != true) {
      return false;
    }
  }
  else {
    bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              mat_purpose,"full");
    if (bVar1) {
      if ((this->materialBindingFull).has_value_ != true) {
        return false;
      }
      this = (MaterialBinding *)&this->materialBindingFull;
    }
    else {
      bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )mat_purpose,"preview");
      if (!bVar1) {
        sVar3 = ::std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Relationship,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Relationship>_>_>
                ::count(&this->_materialBindingMap,&mat_purpose->str_);
        if (sVar3 == 0) {
          return false;
        }
        pRVar2 = ::std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Relationship,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Relationship>_>_>
                 ::at(&this->_materialBindingMap,&mat_purpose->str_);
        goto LAB_0044e799;
      }
      if ((this->materialBindingPreview).has_value_ != true) {
        return false;
      }
      this = (MaterialBinding *)&this->materialBindingPreview;
    }
  }
  pRVar2 = nonstd::optional_lite::optional<tinyusdz::Relationship>::value(&this->materialBinding);
LAB_0044e799:
  Relationship::operator=(relOut,pRVar2);
  return true;
}

Assistant:

bool get_materialBinding(const value::token &mat_purpose, Relationship *relOut) const {
    if (!relOut) {
      return false;
    }

    if (mat_purpose.str().empty()) {
      if (materialBinding.has_value()) {
        (*relOut) = materialBinding.value();
        return true;
      } else {
        return false; // not authored
      }
    } else if (mat_purpose.str() == "full") {
      if (materialBindingFull.has_value()) {
        (*relOut) = materialBindingFull.value();
        return true;
      } else {
        return false; // not authored
      }
    } else if (mat_purpose.str() == "preview") {
      if (materialBindingPreview.has_value()) {
        (*relOut) = materialBindingPreview.value();
        return true;
      } else {
        return false; // not authored
      }
    } else {
      if (_materialBindingMap.count(mat_purpose.str())) {
        (*relOut) = _materialBindingMap.at(mat_purpose.str());
        return true;
      } else {
        return false; // not authored
      }
    }
  }